

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void av1_fp_encode_tiles_row_mt(AV1_COMP *cpi)

{
  int iVar1;
  AV1_COMP *cpi_00;
  AV1_COMP *cpi_01;
  AV1_COMP *cpi_02;
  long in_RDI;
  AV1EncRowMultiThreadSync *row_mt_sync;
  TileDataEnc *this_tile;
  int tile_index;
  int tile_col;
  int tile_row;
  _Bool alloc_tile_data;
  _Bool alloc_row_mt_mem;
  int max_mb_rows;
  int num_workers;
  int *thread_id_to_tile_id;
  int tile_rows;
  int tile_cols;
  AV1EncRowMultiThreadInfo *enc_row_mt;
  MultiThreadInfo *mt_info;
  AV1_COMMON *cm;
  int in_stack_00000164;
  AV1_COMMON *in_stack_00000168;
  MultiThreadInfo *in_stack_00000170;
  int local_60;
  bool local_59;
  int16_t *in_stack_ffffffffffffffa8;
  int num_workers_00;
  AV1_COMP *in_stack_ffffffffffffffb0;
  int local_44;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar2;
  undefined2 in_stack_ffffffffffffffc4;
  undefined1 uVar3;
  int max_cols;
  int max_rows;
  
  cpi_00 = (AV1_COMP *)(in_RDI + 0x3bf80);
  cpi_01 = (AV1_COMP *)(in_RDI + 0x9ae98);
  max_rows = *(int *)(in_RDI + 0x42020);
  max_cols = *(int *)(in_RDI + 0x42024);
  cpi_02 = (AV1_COMP *)(in_RDI + 0x9aea8);
  iVar1 = fp_compute_max_mb_rows((AV1_COMMON *)cpi_00,*(BLOCK_SIZE *)(in_RDI + 0x9d514));
  local_59 = true;
  if ((*(int *)((long)&cpi_01->ppi + 4) == max_rows) &&
     (local_59 = true, *(int *)&cpi_01->ppi == max_cols)) {
    local_59 = *(int *)&cpi_01->field_0x8 != iVar1;
  }
  uVar3 = *(int *)(in_RDI + 0x71320) < max_rows * max_cols;
  if ((bool)uVar3) {
    av1_alloc_tile_data((AV1_COMP *)
                        CONCAT17(local_59,CONCAT16(uVar3,CONCAT24(in_stack_ffffffffffffffc4,
                                                                  in_stack_ffffffffffffffc0))));
  }
  if ((local_59 & 1U) != 0) {
    row_mt_mem_alloc(cpi_01,max_rows,max_cols,(int)((ulong)cpi_02 >> 0x20));
  }
  av1_init_tile_data(cpi_00);
  if (*(int *)(in_RDI + 0x9ae4c) == 0) {
    local_60 = av1_fp_compute_num_enc_workers((AV1_COMP *)CONCAT44(max_rows,max_cols));
  }
  else {
    local_60 = *(int *)(in_RDI + 0x9ae4c);
  }
  memset(cpi_02,0xff,0x100);
  *(undefined1 *)((long)(cpi_01->enc_quant_dequant_params).quants.y_quant[0x10] + 0xd) = 0;
  for (iVar2 = 0; num_workers_00 = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20), iVar2 < max_cols
      ; iVar2 = iVar2 + 1) {
    for (local_44 = 0; local_44 < max_rows; local_44 = local_44 + 1) {
      in_stack_ffffffffffffffb0 =
           (AV1_COMP *)(*(long *)(in_RDI + 0x71318) + (long)(iVar2 * max_rows + local_44) * 0x5d10);
      in_stack_ffffffffffffffa8 =
           (in_stack_ffffffffffffffb0->enc_quant_dequant_params).quants.u_quant_fp[0xcc] + 4;
      memset(*(void **)((in_stack_ffffffffffffffb0->enc_quant_dequant_params).quants.u_quant_fp
                        [0xcd] + 4),0xff,(long)iVar1 << 2);
      *(int *)(in_stack_ffffffffffffffa8 + 0x12) = *(int *)&in_stack_ffffffffffffffb0->ppi;
      *(undefined4 *)(in_stack_ffffffffffffffa8 + 0x14) = 0;
      *(undefined4 *)(in_stack_ffffffffffffffa8 + 0xe) = 0;
    }
  }
  if (*(int *)(in_RDI + 0x9ae48) <= local_60) {
    local_60 = *(int *)(in_RDI + 0x9ae48);
  }
  assign_tile_to_thread((int *)cpi_02,max_rows * max_cols,local_60);
  fp_prepare_enc_workers
            (cpi_02,(AVxWorkerHook)CONCAT44(local_60,iVar1),
             CONCAT13(local_59,CONCAT12(uVar3,in_stack_ffffffffffffffc4)));
  launch_workers((MultiThreadInfo *)in_stack_ffffffffffffffb0,num_workers_00);
  sync_enc_workers(in_stack_00000170,in_stack_00000168,in_stack_00000164);
  dealloc_thread_data_src_diff_buf(in_stack_ffffffffffffffb0,num_workers_00);
  return;
}

Assistant:

void av1_fp_encode_tiles_row_mt(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  MultiThreadInfo *const mt_info = &cpi->mt_info;
  AV1EncRowMultiThreadInfo *const enc_row_mt = &mt_info->enc_row_mt;
  const int tile_cols = cm->tiles.cols;
  const int tile_rows = cm->tiles.rows;
  int *thread_id_to_tile_id = enc_row_mt->thread_id_to_tile_id;
  int num_workers = 0;
  int max_mb_rows = 0;

  max_mb_rows = fp_compute_max_mb_rows(cm, cpi->fp_block_size);
  const bool alloc_row_mt_mem = enc_row_mt->allocated_tile_cols != tile_cols ||
                                enc_row_mt->allocated_tile_rows != tile_rows ||
                                enc_row_mt->allocated_rows != max_mb_rows;
  const bool alloc_tile_data = cpi->allocated_tiles < tile_cols * tile_rows;

  assert(IMPLIES(cpi->tile_data == NULL, alloc_tile_data));
  if (alloc_tile_data) {
    av1_alloc_tile_data(cpi);
  }

  assert(IMPLIES(alloc_tile_data, alloc_row_mt_mem));
  if (alloc_row_mt_mem) {
    row_mt_mem_alloc(cpi, max_mb_rows, -1, 0);
  }

  av1_init_tile_data(cpi);

  // For pass = 1, compute the no. of workers needed. For single-pass encode
  // (pass = 0), no. of workers are already computed.
  if (mt_info->num_mod_workers[MOD_FP] == 0)
    num_workers = av1_fp_compute_num_enc_workers(cpi);
  else
    num_workers = mt_info->num_mod_workers[MOD_FP];

  memset(thread_id_to_tile_id, -1,
         sizeof(*thread_id_to_tile_id) * MAX_NUM_THREADS);
  enc_row_mt->firstpass_mt_exit = false;

  for (int tile_row = 0; tile_row < tile_rows; tile_row++) {
    for (int tile_col = 0; tile_col < tile_cols; tile_col++) {
      int tile_index = tile_row * tile_cols + tile_col;
      TileDataEnc *const this_tile = &cpi->tile_data[tile_index];
      AV1EncRowMultiThreadSync *const row_mt_sync = &this_tile->row_mt_sync;

      // Initialize num_finished_cols to -1 for all rows.
      memset(row_mt_sync->num_finished_cols, -1,
             sizeof(*row_mt_sync->num_finished_cols) * max_mb_rows);
      row_mt_sync->next_mi_row = this_tile->tile_info.mi_row_start;
      row_mt_sync->num_threads_working = 0;

      // intraBC mode is not evaluated during first-pass encoding. Hence, no
      // additional top-right delay is required.
      row_mt_sync->intrabc_extra_top_right_sb_delay = 0;
    }
  }

  num_workers = AOMMIN(num_workers, mt_info->num_workers);
  assign_tile_to_thread(thread_id_to_tile_id, tile_cols * tile_rows,
                        num_workers);
  fp_prepare_enc_workers(cpi, fp_enc_row_mt_worker_hook, num_workers);
  launch_workers(&cpi->mt_info, num_workers);
  sync_enc_workers(&cpi->mt_info, cm, num_workers);
  dealloc_thread_data_src_diff_buf(cpi, num_workers);
}